

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_mpi.c
# Opt level: O2

void Env_mpi_nullify_values_(Env *env)

{
  return;
}

Assistant:

void Env_mpi_nullify_values_( Env *env )
{
#ifdef USE_MPI
  /*---Initialize MPI-related variables in env struct to null---*/
  env->nproc_x_ = 0;
  env->nproc_y_ = 0;
  env->tag_ = 0;
  env->active_comm_ = 0;
  env->is_proc_active_ = 0;
#endif
}